

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O2

void re2::RE2Consume(void)

{
  bool bVar1;
  ostream *poVar2;
  StringPiece input;
  string word;
  string s;
  RE2 r;
  StringPiece local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  char *local_288;
  int local_280;
  LogMessageFatal local_268;
  RE2 local_e8;
  
  RE2::RE2(&local_e8,"\\s*(\\w+)");
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  local_2a8._M_string_length = 0;
  local_2a8.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_288,"   aaa b!@#$@#$cccc",(allocator *)&local_268);
  local_2b8.ptr_ = local_288;
  local_2b8.length_ = local_280;
  local_268.super_LogMessage._0_8_ = &local_2a8;
  bVar1 = RE2::Consume<std::__cxx11::string*>
                    (&local_2b8,&local_e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_268);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0xed);
    std::operator<<((ostream *)&local_268.super_LogMessage.str_,
                    "Check failed: RE2::Consume(&input, r, &word)");
    LogMessageFatal::~LogMessageFatal(&local_268);
  }
  bVar1 = std::operator==(&local_2a8,"aaa");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0xee);
    poVar2 = std::operator<<((ostream *)&local_268.super_LogMessage.str_,
                             "Check failed: (word) == (\"aaa\")");
    poVar2 = std::operator<<(poVar2," input: ");
    operator<<(poVar2,&local_2b8);
    LogMessageFatal::~LogMessageFatal(&local_268);
  }
  local_268.super_LogMessage._0_8_ = &local_2a8;
  bVar1 = RE2::Consume<std::__cxx11::string*>
                    (&local_2b8,&local_e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_268);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0xef);
    std::operator<<((ostream *)&local_268.super_LogMessage.str_,
                    "Check failed: RE2::Consume(&input, r, &word)");
    LogMessageFatal::~LogMessageFatal(&local_268);
  }
  bVar1 = std::operator==(&local_2a8,"b");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0xf0);
    poVar2 = std::operator<<((ostream *)&local_268.super_LogMessage.str_,
                             "Check failed: (word) == (\"b\")");
    poVar2 = std::operator<<(poVar2," input: ");
    operator<<(poVar2,&local_2b8);
    LogMessageFatal::~LogMessageFatal(&local_268);
  }
  local_268.super_LogMessage._0_8_ = &local_2a8;
  bVar1 = RE2::Consume<std::__cxx11::string*>
                    (&local_2b8,&local_e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_268);
  if (bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0xf1);
    poVar2 = std::operator<<((ostream *)&local_268.super_LogMessage.str_,
                             "Check failed: ! RE2::Consume(&input, r, &word)");
    poVar2 = std::operator<<(poVar2," input: ");
    operator<<(poVar2,&local_2b8);
    LogMessageFatal::~LogMessageFatal(&local_268);
  }
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_2a8);
  RE2::~RE2(&local_e8);
  return;
}

Assistant:

TEST(RE2, Consume) {
  VLOG(1) << "TestConsume";

  RE2 r("\\s*(\\w+)");    // matches a word, possibly proceeded by whitespace
  string word;

  string s("   aaa b!@#$@#$cccc");
  StringPiece input(s);

  CHECK(RE2::Consume(&input, r, &word));
  CHECK_EQ(word, "aaa") << " input: " << input;
  CHECK(RE2::Consume(&input, r, &word));
  CHECK_EQ(word, "b") << " input: " << input;
  CHECK(! RE2::Consume(&input, r, &word)) << " input: " << input;
}